

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

Ssw_Cla_t * Ssw_ClassesPrepareFromReprs(Aig_Man_t *pAig)

{
  int *__s2;
  int iVar1;
  Ssw_Cla_t *pSVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pAVar4;
  void *__s1;
  Aig_Obj_t *pAVar5;
  int local_38;
  int local_34;
  int i;
  int nEntries;
  int *pClassSizes;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Ssw_Cla_t *p;
  Aig_Man_t *pAig_local;
  
  pSVar2 = Ssw_ClassesStart(pAig);
  iVar1 = Aig_ManObjNumMax(pAig);
  ppAVar3 = (Aig_Obj_t **)calloc((long)iVar1,8);
  pSVar2->pMemClasses = ppAVar3;
  pSVar2->nCands1 = 0;
  for (local_38 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_38 < iVar1; local_38 = local_38 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_38);
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      iVar1 = Ssw_ObjIsConst1Cand(pAig,pAVar4);
      if (iVar1 == 0) {
        pAVar4 = Aig_ObjRepr(pAig,pAVar4);
        if ((pAVar4 != (Aig_Obj_t *)0x0) &&
           (iVar1 = pSVar2->pClassSizes[pAVar4->Id], pSVar2->pClassSizes[pAVar4->Id] = iVar1 + 1,
           iVar1 == 0)) {
          pSVar2->pClassSizes[pAVar4->Id] = pSVar2->pClassSizes[pAVar4->Id] + 1;
        }
      }
      else {
        pSVar2->nCands1 = pSVar2->nCands1 + 1;
      }
    }
  }
  local_34 = 0;
  pSVar2->nClasses = 0;
  iVar1 = Aig_ManObjNumMax(pAig);
  __s1 = calloc((long)iVar1,4);
  for (local_38 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_38 < iVar1; local_38 = local_38 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_38);
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      if (pSVar2->pClassSizes[local_38] == 0) {
        iVar1 = Ssw_ObjIsConst1Cand(pAig,pAVar4);
        if ((iVar1 == 0) && (pAVar5 = Aig_ObjRepr(pAig,pAVar4), pAVar5 != (Aig_Obj_t *)0x0)) {
          ppAVar3 = pSVar2->pId2Class[pAVar5->Id];
          iVar1 = *(int *)((long)__s1 + (long)pAVar5->Id * 4);
          *(int *)((long)__s1 + (long)pAVar5->Id * 4) = iVar1 + 1;
          ppAVar3[iVar1] = pAVar4;
        }
      }
      else {
        pSVar2->pId2Class[local_38] = pSVar2->pMemClasses + local_34;
        local_34 = pSVar2->pClassSizes[local_38] + local_34;
        ppAVar3 = pSVar2->pId2Class[local_38];
        iVar1 = *(int *)((long)__s1 + (long)local_38 * 4);
        *(int *)((long)__s1 + (long)local_38 * 4) = iVar1 + 1;
        ppAVar3[iVar1] = pAVar4;
        pSVar2->nClasses = pSVar2->nClasses + 1;
      }
    }
  }
  pSVar2->pMemClassesFree = pSVar2->pMemClasses + local_34;
  pSVar2->nLits = local_34 - pSVar2->nClasses;
  __s2 = pSVar2->pClassSizes;
  iVar1 = Aig_ManObjNumMax(pAig);
  iVar1 = memcmp(__s1,__s2,(long)iVar1 << 2);
  if (iVar1 == 0) {
    if (__s1 != (void *)0x0) {
      free(__s1);
    }
    return pSVar2;
  }
  __assert_fail("memcmp(pClassSizes, p->pClassSizes, sizeof(int)*Aig_ManObjNumMax(pAig)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswClass.c"
                ,0x32d,"Ssw_Cla_t *Ssw_ClassesPrepareFromReprs(Aig_Man_t *)");
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepareFromReprs( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    Aig_Obj_t * pObj, * pRepr;
    int * pClassSizes, nEntries, i;
    // start the classes
    p = Ssw_ClassesStart( pAig );
    // allocate memory for classes
    p->pMemClasses = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    // count classes
    p->nCands1 = 0;
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( Ssw_ObjIsConst1Cand(pAig, pObj) )
        {
            p->nCands1++;
            continue;
        }
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) )
        {
            if ( p->pClassSizes[pRepr->Id]++ == 0 )
                p->pClassSizes[pRepr->Id]++;
        }
    }
    // add nodes
    nEntries = 0;
    p->nClasses = 0;
    pClassSizes = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( p->pClassSizes[i] )
        {
            p->pId2Class[i] = p->pMemClasses + nEntries;
            nEntries += p->pClassSizes[i];
            p->pId2Class[i][pClassSizes[i]++] = pObj;
            p->nClasses++;
            continue;
        }
        if ( Ssw_ObjIsConst1Cand(pAig, pObj) )
            continue;
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) )
            p->pId2Class[pRepr->Id][pClassSizes[pRepr->Id]++] = pObj;
    }
    p->pMemClassesFree = p->pMemClasses + nEntries;
    p->nLits = nEntries - p->nClasses;
    assert( memcmp(pClassSizes, p->pClassSizes, sizeof(int)*Aig_ManObjNumMax(pAig)) == 0 );
    ABC_FREE( pClassSizes );
//    Abc_Print( 1, "After converting:\n" );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}